

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

void __thiscall
HookStateStepOut::ProcessHook
          (HookStateStepOut *this,shared_ptr<Debugger> *debugger,lua_State *L,lua_Debug *ar)

{
  element_type *this_00;
  shared_ptr<Debugger> local_58 [2];
  shared_ptr<Debugger> local_38;
  lua_Debug *local_28;
  lua_Debug *ar_local;
  lua_State *L_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStepOut *this_local;
  
  local_28 = ar;
  ar_local = (lua_Debug *)L;
  L_local = (lua_State *)debugger;
  debugger_local = (shared_ptr<Debugger> *)this;
  std::shared_ptr<Debugger>::shared_ptr(&local_38,debugger);
  StackLevelBasedState::UpdateStackLevel
            (&this->super_StackLevelBasedState,&local_38,(lua_State *)ar_local,local_28);
  std::shared_ptr<Debugger>::~shared_ptr(&local_38);
  if ((this->super_StackLevelBasedState).newStackLevel <
      (this->super_StackLevelBasedState).oriStackLevel) {
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         debugger);
    Debugger::HandleBreak(this_00);
  }
  else {
    std::shared_ptr<Debugger>::shared_ptr(local_58,debugger);
    HookState::ProcessHook((HookState *)this,local_58,(lua_State *)ar_local,local_28);
    std::shared_ptr<Debugger>::~shared_ptr(local_58);
  }
  return;
}

Assistant:

void HookStateStepOut::ProcessHook(std::shared_ptr<Debugger> debugger, lua_State* L, lua_Debug* ar)
{
	UpdateStackLevel(debugger, L, ar);
	if (newStackLevel < oriStackLevel)
	{
		debugger->HandleBreak();
		return;
	}
	StackLevelBasedState::ProcessHook(debugger, L, ar);
}